

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataCollectionWithinCollectionScatter<duckdb::ListVector>
               (Vector *child_list,TupleDataVectorFormat *child_list_format,
               SelectionVector *append_sel,idx_t append_count,TupleDataLayout *layout,
               Vector *row_locations,Vector *heap_locations,idx_t col_idx,
               UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  idx_t count;
  byte bVar7;
  bool bVar8;
  ulong uVar9;
  Vector *pVVar10;
  const_reference pvVar11;
  pointer pCVar12;
  const_reference pvVar13;
  idx_t iVar14;
  long lVar15;
  idx_t child_i;
  ulong uVar16;
  idx_t iVar17;
  long *plVar18;
  ValidityBytes child_mask;
  
  pSVar1 = list_data->sel;
  pdVar2 = list_data->data;
  pSVar3 = (child_list_format->unified).sel;
  pdVar4 = (child_list_format->unified).data;
  pdVar5 = heap_locations->data;
  for (iVar14 = 0; iVar14 != append_count; iVar14 = iVar14 + 1) {
    iVar17 = iVar14;
    if (append_sel->sel_vector != (sel_t *)0x0) {
      iVar17 = (idx_t)append_sel->sel_vector[iVar14];
    }
    psVar6 = pSVar1->sel_vector;
    if (psVar6 != (sel_t *)0x0) {
      iVar17 = (idx_t)psVar6[iVar17];
    }
    bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(list_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar17);
    if (bVar8) {
      count = *(idx_t *)(pdVar2 + iVar17 * 0x10 + 8);
      if (count != 0) {
        child_mask.validity_mask = *(uchar **)(pdVar5 + iVar14 * 8);
        child_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        child_mask.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        child_mask.capacity = count;
        TemplatedValidityMask<unsigned_char>::SetAllValid(&child_mask,count);
        plVar18 = (long *)(pdVar2 + iVar17 * 0x10);
        uVar9 = plVar18[1];
        lVar15 = (uVar9 + 7 >> 3) + *(long *)(pdVar5 + iVar14 * 8);
        *(ulong *)(pdVar5 + iVar14 * 8) = lVar15 + uVar9 * 8;
        for (uVar16 = 0; uVar16 < uVar9; uVar16 = uVar16 + 1) {
          iVar17 = *plVar18 + uVar16;
          psVar6 = pSVar3->sel_vector;
          if (psVar6 != (sel_t *)0x0) {
            iVar17 = (idx_t)psVar6[iVar17];
          }
          bVar8 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(child_list_format->unified).validity.
                              super_TemplatedValidityMask<unsigned_long>,iVar17);
          if (bVar8) {
            *(undefined8 *)(lVar15 + uVar16 * 8) = *(undefined8 *)(pdVar4 + iVar17 * 0x10 + 8);
          }
          else {
            bVar7 = (byte)uVar16 & 7;
            child_mask.validity_mask[uVar16 >> 3] =
                 child_mask.validity_mask[uVar16 >> 3] & (-2 << bVar7 | 0xfeU >> 8 - bVar7);
          }
          uVar9 = plVar18[1];
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&child_mask.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
  }
  pVVar10 = ListVector::GetEntry(child_list);
  pvVar11 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(&child_list_format->children,0);
  pCVar12 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
            ::operator->(&pvVar11->combined_list_data);
  pvVar13 = vector<duckdb::TupleDataScatterFunction,_true>::get<true>(child_functions,0);
  (*pvVar13->function)
            (pVVar10,pvVar11,append_sel,append_count,layout,row_locations,heap_locations,col_idx,
             &pCVar12->combined_data,&pvVar13->child_functions);
  return;
}

Assistant:

static void TupleDataCollectionWithinCollectionScatter(const Vector &child_list,
                                                       const TupleDataVectorFormat &child_list_format,
                                                       const SelectionVector &append_sel, const idx_t append_count,
                                                       const TupleDataLayout &layout, const Vector &row_locations,
                                                       Vector &heap_locations, const idx_t col_idx,
                                                       const UnifiedVectorFormat &list_data,
                                                       const vector<TupleDataScatterFunction> &child_functions) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &child_list_data = child_list_format.unified;
	const auto &child_list_sel = *child_list_data.sel;
	const auto child_list_entries = UnifiedVectorFormat::GetData<list_entry_t>(child_list_data);
	const auto &child_list_validity = child_list_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child list
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * sizeof(uint64_t);

		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (child_list_validity.RowIsValid(child_list_idx)) {
				const auto &child_list_length = child_list_entries[child_list_idx].length;
				Store<uint64_t>(child_list_length, child_data_location + child_i * sizeof(uint64_t));
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}

	// Recurse
	D_ASSERT(child_functions.size() == 1);
	auto &child_vec = COLLECTION_VECTOR::GetEntry(child_list);
	auto &child_format = child_list_format.children[0];
	auto &combined_child_list_data = child_format.combined_list_data->combined_data;
	const auto &child_function = child_functions[0];
	child_function.function(child_vec, child_format, append_sel, append_count, layout, row_locations, heap_locations,
	                        col_idx, combined_child_list_data, child_function.child_functions);
}